

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O3

void glcts::CullDistance::Utilities::buildProgram
               (Functions *gl,TestContext *testCtx,GLchar *cs_body,GLchar *fs_body,GLchar *gs_body,
               GLchar *tc_body,GLchar *te_body,GLchar *vs_body,GLuint *n_tf_varyings,
               GLchar **tf_varyings,GLuint *out_program)

{
  ostringstream *poVar1;
  pointer pcVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLuint GVar5;
  value_type *__val;
  size_t sVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  char *pcVar9;
  long lVar10;
  GLchar **value;
  string log_string;
  _shaders_configuration shaders_configuration [6];
  GLint local_290;
  GLint local_28c;
  vector<char,_std::allocator<char>_> local_288;
  TestContext *local_270;
  char *local_268;
  long local_260;
  char local_258 [16];
  char *local_248;
  GLchar *local_240;
  undefined4 local_238;
  undefined4 local_230;
  GLchar *local_228;
  undefined4 local_220;
  undefined4 local_218;
  GLchar *local_210;
  undefined4 local_208;
  undefined4 local_200;
  GLchar *local_1f8;
  undefined4 local_1f0;
  undefined4 local_1e8;
  GLchar *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d0;
  GLchar *local_1c8;
  undefined4 local_1c0;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  local_248._0_4_ = 0x91b9;
  local_238 = 0;
  local_230 = 0x8b30;
  local_220 = 0;
  local_218 = 0x8dd9;
  local_208 = 0;
  local_200 = 0x8e88;
  local_1f0 = 0;
  local_1e8 = 0x8e87;
  local_1e0 = te_body;
  local_1d8 = 0;
  local_1d0 = 0x8b31;
  local_1c8 = vs_body;
  local_1c0 = 0;
  local_270 = testCtx;
  local_240 = cs_body;
  local_228 = fs_body;
  local_210 = gs_body;
  local_1f8 = tc_body;
  GVar3 = (*gl->createProgram)();
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0x5d);
  lVar10 = 6;
  value = &local_240;
  do {
    if (*value != (char *)0x0) {
      GVar5 = (*gl->createShader)(*(GLenum *)(value + -1));
      *(GLuint *)(value + 1) = GVar5;
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCreateShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x65);
      local_28c = 0;
      GVar5 = *(GLuint *)(value + 1);
      (*gl->shaderSource)(GVar5,1,value,(GLint *)0x0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glShaderSource() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x6d);
      (*gl->compileShader)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x70);
      (*gl->getShaderiv)(GVar5,0x8b81,&local_28c);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x73);
      if (local_28c == 0) {
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)operator_new(1);
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
        *local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start = '\0';
        local_290 = 0;
        local_268 = local_258;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"Failed to retrieve log","");
        (*gl->getShaderiv)(GVar5,0x8b84,&local_290);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x7d);
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        std::vector<char,_std::allocator<char>_>::resize(&local_288,(long)(local_290 + 1),local_1b0)
        ;
        (*gl->getShaderInfoLog)
                  (GVar5,local_290,(GLsizei *)0x0,
                   local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x82);
        pcVar2 = local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar9 = &DAT_00000001;
        local_1b0._0_8_ = local_1a0;
        if (local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (char *)0x0) {
          sVar6 = strlen(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
          pcVar9 = pcVar2 + sVar6;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,pcVar2,pcVar9);
        std::__cxx11::string::operator=((string *)&local_268,(string *)local_1b0);
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        local_1b0._0_8_ = local_270->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_268,local_260);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader source code:\n",0x14);
        pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Shader compilation has failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                   ,0x8e);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->attachShader)(GVar3,GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glAttachShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x94);
    }
    value = value + 3;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  if (*n_tf_varyings != 0) {
    (*gl->transformFeedbackVaryings)(GVar3,*n_tf_varyings,tf_varyings,0x8c8c);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glTransformFeedbackVaryings() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0x9c);
  }
  if (GVar3 != 0) {
    local_28c = 0;
    (*gl->linkProgram)(GVar3);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glLinkProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xa5);
    (*gl->getProgramiv)(GVar3,0x8b82,&local_28c);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xa8);
    if (local_28c == 0) {
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(1);
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      *local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = '\0';
      local_290 = 0;
      local_268 = local_258;
      local_260 = 0;
      local_258[0] = '\0';
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      (*gl->getProgramiv)(GVar3,0x8b84,&local_290);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xb2);
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::resize(&local_288,(long)(local_290 + 1),local_1b0);
      (*gl->getProgramInfoLog)
                (GVar3,local_290,(GLsizei *)0x0,
                 local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetProgramInfoLog() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xb8);
      pcVar2 = local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar9 = &DAT_00000001;
      local_1b0._0_8_ = local_1a0;
      if (local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        sVar6 = strlen(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        pcVar9 = pcVar2 + sVar6;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,pcVar2,pcVar9);
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_1b0);
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      local_1b0._0_8_ = local_270->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Program linking has failed.\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Linking error log:\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar10 = 8;
      do {
        if (*(long *)((long)&local_248 + lVar10) != 0) {
          local_1b0._0_8_ = local_270->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Shader source code of type ",0x1b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," follows:\n",10);
          pMVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,(char **)((long)&local_248 + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x98);
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                 ,0xce);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  lVar10 = 0x10;
  do {
    if (*(GLuint *)((long)&local_248 + lVar10) != 0) {
      (*gl->deleteShader)(*(GLuint *)((long)&local_248 + lVar10));
      *(undefined4 *)((long)&local_248 + lVar10) = 0;
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glDeleteShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xdd);
    }
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0xa0);
  *out_program = GVar3;
  return;
}

Assistant:

void CullDistance::Utilities::buildProgram(const glw::Functions& gl, tcu::TestContext& testCtx,
										   const glw::GLchar* cs_body, const glw::GLchar* fs_body,
										   const glw::GLchar* gs_body, const glw::GLchar* tc_body,
										   const glw::GLchar* te_body, const glw::GLchar* vs_body,
										   const glw::GLuint& n_tf_varyings, const glw::GLchar** tf_varyings,
										   glw::GLuint* out_program)
{
	glw::GLuint po_id = 0;

	struct _shaders_configuration
	{
		glw::GLenum		   type;
		const glw::GLchar* body;
		glw::GLuint		   id;
	} shaders_configuration[] = { { GL_COMPUTE_SHADER, cs_body, 0 },		 { GL_FRAGMENT_SHADER, fs_body, 0 },
								  { GL_GEOMETRY_SHADER, gs_body, 0 },		 { GL_TESS_CONTROL_SHADER, tc_body, 0 },
								  { GL_TESS_EVALUATION_SHADER, te_body, 0 }, { GL_VERTEX_SHADER, vs_body, 0 } };

	const glw::GLuint n_shaders_configuration = sizeof(shaders_configuration) / sizeof(shaders_configuration[0]);

	/* Guard allocated OpenGL resources */
	try
	{
		/* Create needed programs */
		po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			if (shaders_configuration[n_shader_index].body != DE_NULL)
			{
				/* Generate shader object */
				shaders_configuration[n_shader_index].id = gl.createShader(shaders_configuration[n_shader_index].type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				glw::GLint		  compile_status = GL_FALSE;
				const glw::GLuint so_id			 = shaders_configuration[n_shader_index].id;

				/* Assign shader source code */
				gl.shaderSource(shaders_configuration[n_shader_index].id, 1,		   /* count */
								&shaders_configuration[n_shader_index].body, DE_NULL); /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_FALSE)
				{
					std::vector<glw::GLchar> log_array(1);
					glw::GLint				 log_length = 0;
					std::string				 log_string("Failed to retrieve log");

					/* Retrive compilation log length */
					gl.getShaderiv(so_id, GL_INFO_LOG_LENGTH, &log_length);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

					log_array.resize(log_length + 1, 0);

					gl.getShaderInfoLog(so_id, log_length, DE_NULL, &log_array[0]);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

					log_string = std::string(&log_array[0]);

					testCtx.getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
									 << "Shader type: " << shaders_configuration[n_shader_index].type << "\n"
									 << "Shader compilation error log:\n"
									 << log_string << "\n"
									 << "Shader source code:\n"
									 << shaders_configuration[n_shader_index].body << "\n"
									 << tcu::TestLog::EndMessage;

					TCU_FAIL("Shader compilation has failed.");
				}

				/* Also attach the shader to the corresponding program object */
				gl.attachShader(po_id, so_id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
			} /* if (shaders_configuration[n_shader_index].body != DE_NULL) */
		}	 /* for (all shader object IDs) */

		/* Set transform feedback if requested */
		if (n_tf_varyings > 0)
		{
			gl.transformFeedbackVaryings(po_id, n_tf_varyings, tf_varyings, GL_INTERLEAVED_ATTRIBS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");
		}

		/* Try to link the program objects */
		if (po_id != 0)
		{
			glw::GLint link_status = GL_FALSE;

			gl.linkProgram(po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

			gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

			if (link_status == GL_FALSE)
			{
				std::vector<glw::GLchar> log_array(1);
				glw::GLsizei			 log_length = 0;
				std::string				 log_string;

				/* Retreive compilation log length */
				gl.getProgramiv(po_id, GL_INFO_LOG_LENGTH, &log_length);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

				log_array.resize(log_length + 1, 0);

				/* Retreive compilation log */
				gl.getProgramInfoLog(po_id, log_length, DE_NULL, &log_array[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

				log_string = std::string(&log_array[0]);

				/* Log linking error message */
				testCtx.getLog() << tcu::TestLog::Message << "Program linking has failed.\n"
								 << "Linking error log:\n"
								 << log_string << "\n"
								 << tcu::TestLog::EndMessage;

				/* Log shader source code of shaders involved */
				for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
				{
					if (shaders_configuration[n_shader_index].body != DE_NULL)
					{
						testCtx.getLog() << tcu::TestLog::Message << "Shader source code of type "
										 << shaders_configuration[n_shader_index].type << " follows:\n"
										 << shaders_configuration[n_shader_index].body << "\n"
										 << tcu::TestLog::EndMessage;
					}
				}

				TCU_FAIL("Program linking failed");
			}
		} /* if (po_id != 0) */

		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			}
		}

		/* Store the result progrtam IDs */
		*out_program = po_id;
	}
	catch (...)
	{
		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;
			}
		}

		/* Delete the program object */
		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}

		/* Rethrow */
		throw;
	}
}